

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_getDictHeaderSize(void *dictBuffer,size_t dictSize)

{
  U32 UVar1;
  ZSTD_compressedBlockState_t *bs_00;
  void *__ptr;
  ulong in_RSI;
  U32 *wksp;
  ZSTD_compressedBlockState_t *bs;
  size_t headerSize;
  size_t in_stack_00000150;
  void *in_stack_00000158;
  void *in_stack_00000160;
  ZSTD_compressedBlockState_t *in_stack_00000168;
  void *in_stack_ffffffffffffffc8;
  size_t local_20;
  
  if ((8 < in_RSI) && (UVar1 = MEM_readLE32(in_stack_ffffffffffffffc8), UVar1 == 0xec30a437)) {
    bs_00 = (ZSTD_compressedBlockState_t *)malloc(0x1600);
    __ptr = malloc(0x2200);
    if ((bs_00 == (ZSTD_compressedBlockState_t *)0x0) || (__ptr == (void *)0x0)) {
      local_20 = 0xffffffffffffffc0;
    }
    else {
      ZSTD_reset_compressedBlockState(bs_00);
      local_20 = ZSTD_loadCEntropy(in_stack_00000168,in_stack_00000160,in_stack_00000158,
                                   in_stack_00000150);
    }
    free(bs_00);
    free(__ptr);
    return local_20;
  }
  return 0xffffffffffffffe2;
}

Assistant:

size_t ZDICT_getDictHeaderSize(const void* dictBuffer, size_t dictSize)
{
    size_t headerSize;
    if (dictSize <= 8 || MEM_readLE32(dictBuffer) != ZSTD_MAGIC_DICTIONARY) return ERROR(dictionary_corrupted);

    {   ZSTD_compressedBlockState_t* bs = (ZSTD_compressedBlockState_t*)malloc(sizeof(ZSTD_compressedBlockState_t));
        U32* wksp = (U32*)malloc(HUF_WORKSPACE_SIZE);
        if (!bs || !wksp) {
            headerSize = ERROR(memory_allocation);
        } else {
            ZSTD_reset_compressedBlockState(bs);
            headerSize = ZSTD_loadCEntropy(bs, wksp, dictBuffer, dictSize);
        }

        free(bs);
        free(wksp);
    }

    return headerSize;
}